

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O0

int splittingStep_InitStepMem
              (ARKodeMem ark_mem,ARKodeSplittingStepMem step_mem,SUNStepper *steppers,int partitions
              )

{
  void *pvVar1;
  int in_ECX;
  SplittingStepCoefficients *in_RDX;
  long *in_RSI;
  ARKodeMem in_RDI;
  int local_4;
  
  if (*in_RSI != 0) {
    free((void *)*in_RSI);
  }
  pvVar1 = malloc((long)in_ECX << 3);
  *in_RSI = (long)pvVar1;
  if (*in_RSI == 0) {
    arkProcessError(in_RDI,-0x14,0x218,"splittingStep_InitStepMem",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                    ,"Allocation of arkode_mem failed.");
    local_4 = -0x14;
  }
  else {
    memcpy((void *)*in_RSI,in_RDX,(long)in_ECX << 3);
    if (in_RSI[2] != 0) {
      free((void *)in_RSI[2]);
    }
    pvVar1 = calloc((long)in_ECX,8);
    in_RSI[2] = (long)pvVar1;
    if ((int)in_RSI[3] != in_ECX) {
      SplittingStepCoefficients_Destroy(in_RDX);
    }
    *(int *)(in_RSI + 3) = in_ECX;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int splittingStep_InitStepMem(ARKodeMem ark_mem,
                                     ARKodeSplittingStepMem step_mem,
                                     SUNStepper* steppers, int partitions)
{
  if (step_mem->steppers != NULL) { free(step_mem->steppers); }
  step_mem->steppers = malloc(partitions * sizeof(*steppers));
  if (step_mem->steppers == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_ARKMEM_FAIL);
    return ARK_MEM_FAIL;
  }
  memcpy(step_mem->steppers, steppers, partitions * sizeof(*steppers));

  if (step_mem->n_stepper_evolves != NULL)
  {
    free(step_mem->n_stepper_evolves);
  }
  step_mem->n_stepper_evolves = calloc(partitions,
                                       sizeof(*step_mem->n_stepper_evolves));

  /* If the number of partitions changed, the coefficients are no longer
   * compatible and must be cleared. If a user previously called ARKodeSetOrder
   * that will still be respected at the next call to ARKodeEvolve */
  if (step_mem->partitions != partitions)
  {
    SplittingStepCoefficients_Destroy(&step_mem->coefficients);
  }
  step_mem->partitions = partitions;

  return ARK_SUCCESS;
}